

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_encryptor.cpp
# Opt level: O2

void __thiscall
cppcms::sessions::impl::hmac_cipher::hmac_cipher(hmac_cipher *this,string *hash_name,key *k)

{
  size_t sVar1;
  cppcms_error *this_00;
  allocator local_49;
  string local_48;
  
  (this->super_encryptor)._vptr_encryptor = (_func_int **)&PTR_encrypt_002b7548;
  crypto::key::key(&this->key_,k);
  std::__cxx11::string::string((string *)&this->hash_,(string *)hash_name);
  sVar1 = crypto::key::size(&this->key_);
  if (0xf < sVar1) {
    return;
  }
  this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_48,
             "The key legth is too small, use at leaset the key of 16 bytes/32 hexadecimal digits",
             &local_49);
  cppcms_error::cppcms_error(this_00,&local_48);
  __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

hmac_cipher::hmac_cipher(std::string const &hash_name,crypto::key const &k) :
	key_(k),
	hash_(hash_name)
{
	if(key_.size() < 16) {
		throw cppcms_error("The key legth is too small, use at leaset the key of 16 bytes/32 hexadecimal digits");
	}
}